

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

void cursor_position_callback(GLFWwindow *window,double x,double y)

{
  int iVar1;
  double y_local;
  double x_local;
  GLFWwindow *window_local;
  
  iVar1 = glfwGetInputMode(window,0x33001);
  if (iVar1 == 0x34003) {
    alpha = (float)(x - cursorX) / 10.0 + alpha;
    beta = (float)(y - cursorY) / 10.0 + beta;
    cursorX = x;
    cursorY = y;
  }
  return;
}

Assistant:

void cursor_position_callback(GLFWwindow* window, double x, double y)
{
    if (glfwGetInputMode(window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
    {
        alpha += (GLfloat) (x - cursorX) / 10.f;
        beta += (GLfloat) (y - cursorY) / 10.f;

        cursorX = x;
        cursorY = y;
    }
}